

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

int ON_JoinCurvesOld(ON_SimpleArray<const_ON_Curve_*> *InCurves,
                    ON_SimpleArray<ON_Curve_*> *OutCurves,double join_tol,bool bPreserveDirection,
                    ON_SimpleArray<int> *key)

{
  undefined4 uVar1;
  long lVar2;
  double dVar3;
  ON_Curve *pOVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ON_SimpleArray<int> *pOVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ON_Curve **ppOVar15;
  undefined4 extraout_var;
  int *piVar16;
  ON_3dPoint *pOVar17;
  ON_3dPoint *pOVar18;
  OldCurveJoinEndData *pOVar19;
  void *__s;
  ON_SimpleArray<OldCurveJoinSeg> *pOVar20;
  OldCurveJoinSeg *pOVar21;
  OldCurveJoinSeg *pOVar22;
  ON_PolyCurve *pOVar23;
  undefined4 extraout_var_00;
  double *pdVar24;
  ON_Interval OVar25;
  ON_3dPoint local_350;
  ON_Curve *local_338;
  ON_Curve *C_2;
  ON_Interval local_328;
  double local_318;
  double t;
  ON_Curve *local_2f8;
  ON_Curve *SCCopy;
  ON_Curve *SC;
  ON_PolyCurve *pOStack_2e0;
  int si;
  ON_PolyCurve *pPoly;
  ON_PolyCurve *pOStack_2d0;
  int k;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  ON_NurbsCurve *local_2b0;
  ON_NurbsCurve *NC;
  double dStack_2a0;
  double local_298;
  double local_288;
  double dStack_280;
  double local_278;
  ON_3dPoint local_270;
  ON_3dPoint local_258;
  undefined1 local_240 [8];
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_NurbsCurve *pOStack_200;
  bool bSet;
  ON_Curve *C_1;
  int min_id;
  int min_seg;
  int j_5;
  bool pc_added;
  ON_PolyCurve *PC;
  int j_6;
  int scount;
  ON_SimpleArray<OldCurveJoinSeg> *SArray_3;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  ON_SimpleArray<OldCurveJoinSeg> *SArray1;
  ON_SimpleArray<OldCurveJoinSeg> *SArray0;
  int segid1;
  int segid0;
  OldCurveJoinSeg *Seg_3;
  OldCurveJoinSeg Seg_2;
  ON_SimpleArray<OldCurveJoinSeg> *SArray_2;
  OldCurveJoinSeg *Seg_1;
  OldCurveJoinSeg Seg;
  ON_SimpleArray<OldCurveJoinSeg> *SArray_1;
  OldCurveJoinSeg *Seg1;
  OldCurveJoinSeg *Seg0;
  ON_SimpleArray<OldCurveJoinSeg> *SArray;
  OldCurveJoinEndData *ED_3;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> SegsArray;
  int **endarray;
  int *endspace;
  OldCurveJoinEndData *ED_2;
  OldCurveJoinEndData *ED_1;
  OldCurveJoinEndData *ED;
  double dist;
  undefined1 local_108 [4];
  int j;
  ON_SimpleArray<OldCurveJoinEndData> EData;
  double local_e8;
  double local_e0;
  ON_3dPoint local_d8;
  undefined1 local_c0 [8];
  ON_3dPointArray End;
  ON_3dPointArray Start;
  ON_Curve *C;
  undefined1 local_78 [8];
  ON_SimpleArray<int> cmap;
  ON_SimpleArray<ON_Curve_*> IC;
  int dim;
  int count;
  int i;
  ON_SimpleArray<int> *key_local;
  double dStack_28;
  bool bPreserveDirection_local;
  double join_tol_local;
  ON_SimpleArray<ON_Curve_*> *OutCurves_local;
  ON_SimpleArray<const_ON_Curve_*> *InCurves_local;
  
  _count = key;
  key_local._7_1_ = bPreserveDirection;
  dStack_28 = join_tol;
  join_tol_local = (double)OutCurves;
  OutCurves_local = (ON_SimpleArray<ON_Curve_*> *)InCurves;
  iVar11 = ON_SimpleArray<ON_Curve_*>::Count(OutCurves);
  iVar12 = ON_SimpleArray<const_ON_Curve_*>::Count
                     ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local);
  if (iVar12 < 1) {
    InCurves_local._4_4_ = 0;
  }
  else {
    ppOVar15 = ON_SimpleArray<const_ON_Curve_*>::operator[]
                         ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local,0);
    IC.m_capacity = (*((*ppOVar15)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    for (dim = 1; iVar12 = dim,
        iVar13 = ON_SimpleArray<const_ON_Curve_*>::Count
                           ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local), pOVar8 = _count,
        iVar12 < iVar13; dim = dim + 1) {
      ppOVar15 = ON_SimpleArray<const_ON_Curve_*>::operator[]
                           ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local,dim);
      iVar12 = (*((*ppOVar15)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar12 != IC.m_capacity) {
        return 0;
      }
    }
    if (_count != (ON_SimpleArray<int> *)0x0) {
      iVar12 = ON_SimpleArray<const_ON_Curve_*>::Count
                         ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local);
      ON_SimpleArray<int>::Reserve(pOVar8,(long)iVar12);
      for (dim = 0; iVar12 = dim,
          iVar13 = ON_SimpleArray<const_ON_Curve_*>::Count
                             ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local), iVar12 < iVar13;
          dim = dim + 1) {
        IC.m_count = -1;
        ON_SimpleArray<int>::Append(_count,&IC.m_count);
      }
    }
    dVar3 = join_tol_local;
    iVar12 = ON_SimpleArray<const_ON_Curve_*>::Count
                       ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local);
    ON_SimpleArray<ON_Curve_*>::Reserve((ON_SimpleArray<ON_Curve_*> *)dVar3,(long)iVar12);
    iVar12 = ON_SimpleArray<const_ON_Curve_*>::Count
                       ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local);
    ON_SimpleArray<ON_Curve_*>::ON_SimpleArray
              ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,(long)iVar12);
    iVar12 = ON_SimpleArray<const_ON_Curve_*>::Count
                       ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local);
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_78,(long)iVar12);
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<const_ON_Curve_*>::Count
                           ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local), iVar12 < iVar13;
        dim = dim + 1) {
      ppOVar15 = ON_SimpleArray<const_ON_Curve_*>::operator[]
                           ((ON_SimpleArray<const_ON_Curve_*> *)OutCurves_local,dim);
      iVar12 = (*((*ppOVar15)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      Start.super_ON_SimpleArray<ON_3dPoint>._16_8_ = CONCAT44(extraout_var,iVar12);
      if ((long *)Start.super_ON_SimpleArray<ON_3dPoint>._16_8_ != (long *)0x0) {
        bVar9 = (**(code **)(*(long *)Start.super_ON_SimpleArray<ON_3dPoint>._16_8_ + 0x1a0))();
        if ((bVar9 & 1) == 0) {
          ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_78,&dim);
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,
                     (ON_Curve **)&Start.super_ON_SimpleArray<ON_3dPoint>.m_count);
        }
        else {
          if (_count != (ON_SimpleArray<int> *)0x0) {
            iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)join_tol_local)
            ;
            piVar16 = ON_SimpleArray<int>::operator[](_count,dim);
            *piVar16 = iVar12;
          }
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)join_tol_local,
                     (ON_Curve **)&Start.super_ON_SimpleArray<ON_3dPoint>.m_count);
        }
      }
    }
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_3dPointArray::ON_3dPointArray
              ((ON_3dPointArray *)&End.super_ON_SimpleArray<ON_3dPoint>.m_count,iVar12);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_SimpleArray<ON_3dPoint>::SetCount
              ((ON_SimpleArray<ON_3dPoint> *)&End.super_ON_SimpleArray<ON_3dPoint>.m_count,iVar12);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_c0,iVar12);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)local_c0,iVar12);
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count),
        iVar12 < iVar13; dim = dim + 1) {
      ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                           ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,dim);
      ON_Curve::PointAtStart(&local_d8,*ppOVar15);
      pOVar17 = ON_SimpleArray<ON_3dPoint>::operator[]
                          ((ON_SimpleArray<ON_3dPoint> *)
                           &End.super_ON_SimpleArray<ON_3dPoint>.m_count,dim);
      pOVar17->z = local_d8.z;
      pOVar17->x = local_d8.x;
      pOVar17->y = local_d8.y;
      ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                           ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,dim);
      ON_Curve::PointAtEnd((ON_3dPoint *)&EData.m_count,*ppOVar15);
      pOVar17 = ON_SimpleArray<ON_3dPoint>::operator[]((ON_SimpleArray<ON_3dPoint> *)local_c0,dim);
      pOVar17->x = (double)EData._16_8_;
      pOVar17->y = local_e8;
      pOVar17->z = local_e0;
    }
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_SimpleArray<OldCurveJoinEndData>::ON_SimpleArray
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_108,(long)iVar12);
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count),
        iVar12 < iVar13; dim = dim + 1) {
      for (dist._4_4_ = 0;
          iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count),
          dist._4_4_ < iVar12; dist._4_4_ = dist._4_4_ + 1) {
        if (dim != dist._4_4_) {
          pOVar17 = ON_SimpleArray<ON_3dPoint>::operator[]
                              ((ON_SimpleArray<ON_3dPoint> *)
                               &End.super_ON_SimpleArray<ON_3dPoint>.m_count,dim);
          pOVar18 = ON_SimpleArray<ON_3dPoint>::operator[]
                              ((ON_SimpleArray<ON_3dPoint> *)local_c0,dist._4_4_);
          dVar3 = ON_3dPoint::DistanceTo(pOVar17,pOVar18);
          if (dVar3 <= dStack_28) {
            pOVar19 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                ((ON_SimpleArray<OldCurveJoinEndData> *)local_108);
            pOVar19->id[0] = dim;
            pOVar19->end[0] = 0;
            pOVar19->id[1] = dist._4_4_;
            pOVar19->end[1] = 1;
            pOVar19->dist = dVar3;
          }
          if (((key_local._7_1_ & 1) == 0) && (dim < dist._4_4_)) {
            pOVar17 = ON_SimpleArray<ON_3dPoint>::operator[]
                                ((ON_SimpleArray<ON_3dPoint> *)
                                 &End.super_ON_SimpleArray<ON_3dPoint>.m_count,dim);
            pOVar18 = ON_SimpleArray<ON_3dPoint>::operator[]
                                ((ON_SimpleArray<ON_3dPoint> *)
                                 &End.super_ON_SimpleArray<ON_3dPoint>.m_count,dist._4_4_);
            dVar3 = ON_3dPoint::DistanceTo(pOVar17,pOVar18);
            if (dVar3 <= dStack_28) {
              pOVar19 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                  ((ON_SimpleArray<OldCurveJoinEndData> *)local_108);
              pOVar19->id[0] = dim;
              pOVar19->end[0] = 0;
              pOVar19->id[1] = dist._4_4_;
              pOVar19->end[1] = 0;
              pOVar19->dist = dVar3;
            }
            pOVar17 = ON_SimpleArray<ON_3dPoint>::operator[]
                                ((ON_SimpleArray<ON_3dPoint> *)local_c0,dim);
            pOVar18 = ON_SimpleArray<ON_3dPoint>::operator[]
                                ((ON_SimpleArray<ON_3dPoint> *)local_c0,dist._4_4_);
            dVar3 = ON_3dPoint::DistanceTo(pOVar17,pOVar18);
            if (dVar3 <= dStack_28) {
              pOVar19 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                  ((ON_SimpleArray<OldCurveJoinEndData> *)local_108);
              pOVar19->id[0] = dim;
              pOVar19->end[0] = 1;
              pOVar19->id[1] = dist._4_4_;
              pOVar19->end[1] = 1;
              pOVar19->dist = dVar3;
            }
          }
        }
      }
    }
    ON_SimpleArray<OldCurveJoinEndData>::QuickSort
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_108,OldCompareEndData);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    __s = onmalloc((long)iVar12 << 3);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    memset(__s,0,(long)iVar12 << 3);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    SegsArray._16_8_ = onmalloc((long)iVar12 << 3);
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count),
        iVar12 < iVar13; dim = dim + 1) {
      *(void **)(SegsArray._16_8_ + (long)dim * 8) = (void *)((long)__s + (long)(dim << 1) * 4);
    }
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::ON_ClassArray
              ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,(long)iVar12);
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<OldCurveJoinEndData>::Count
                           ((ON_SimpleArray<OldCurveJoinEndData> *)local_108), iVar12 < iVar13;
        dim = dim + 1) {
      pOVar19 = ON_SimpleArray<OldCurveJoinEndData>::operator[]
                          ((ON_SimpleArray<OldCurveJoinEndData> *)local_108,dim);
      if ((*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                   (long)pOVar19->end[0] * 4) < 1) &&
         (*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                  (long)pOVar19->end[1] * 4) < 1)) {
        if (*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                    (long)(1 - pOVar19->end[0]) * 4) == 0) {
          if (*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                      (long)(1 - pOVar19->end[1]) * 4) == 0) {
            iVar12 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::Count
                               ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3);
            *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                    (long)pOVar19->end[1] * 4) = iVar12 + 1;
            *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                    (long)pOVar19->end[0] * 4) = iVar12 + 1;
            pOVar20 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::AppendNew
                                ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3);
            ON_SimpleArray<OldCurveJoinSeg>::Reserve(pOVar20,4);
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar20);
            pOVar22 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar20);
            if (pOVar19->end[0] == 0) {
              pOVar22->id = pOVar19->id[0];
              pOVar22->bRev = false;
              pOVar21->id = pOVar19->id[1];
              pOVar21->bRev = (bool)(-(pOVar19->end[1] == 0) & 1);
            }
            else {
              pOVar21->id = pOVar19->id[0];
              pOVar21->bRev = false;
              pOVar22->id = pOVar19->id[1];
              pOVar22->bRev = (bool)(-(pOVar19->end[1] != 0) & 1);
            }
          }
          else {
            Seg = (OldCurveJoinSeg)
                  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::operator[]
                            ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,
                             *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                                     (long)(1 - pOVar19->end[1]) * 4) + -1);
            lVar2 = *(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8);
            uVar1 = *(undefined4 *)(lVar2 + (long)(1 - pOVar19->end[1]) * 4);
            *(undefined4 *)(lVar2 + (long)pOVar19->end[1] * 4) = uVar1;
            *(undefined4 *)
             (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) + (long)pOVar19->end[0] * 4) =
                 uVar1;
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[]
                                ((ON_SimpleArray<OldCurveJoinSeg> *)Seg,0);
            if (pOVar21->id == pOVar19->id[1]) {
              Seg_1._0_4_ = pOVar19->id[0];
              Seg_1._4_1_ = pOVar19->end[0] == 0;
              ON_SimpleArray<OldCurveJoinSeg>::Insert
                        ((ON_SimpleArray<OldCurveJoinSeg> *)Seg,0,(OldCurveJoinSeg *)&Seg_1);
            }
            else {
              pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew
                                  ((ON_SimpleArray<OldCurveJoinSeg> *)Seg);
              pOVar21->id = pOVar19->id[0];
              pOVar21->bRev = (bool)(-(pOVar19->end[0] != 0) & 1);
            }
          }
        }
        else if (*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                         (long)(1 - pOVar19->end[1]) * 4) == 0) {
          Seg_2 = (OldCurveJoinSeg)
                  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::operator[]
                            ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,
                             *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                                     (long)(1 - pOVar19->end[0]) * 4) + -1);
          uVar1 = *(undefined4 *)
                   (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                   (long)(1 - pOVar19->end[0]) * 4);
          *(undefined4 *)
           (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) + (long)pOVar19->end[1] * 4) =
               uVar1;
          *(undefined4 *)
           (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) + (long)pOVar19->end[0] * 4) =
               uVar1;
          pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[]
                              ((ON_SimpleArray<OldCurveJoinSeg> *)Seg_2,0);
          if (pOVar21->id == pOVar19->id[0]) {
            Seg_3._0_4_ = pOVar19->id[1];
            Seg_3._4_1_ = pOVar19->end[1] == 0;
            ON_SimpleArray<OldCurveJoinSeg>::Insert
                      ((ON_SimpleArray<OldCurveJoinSeg> *)Seg_2,0,(OldCurveJoinSeg *)&Seg_3);
          }
          else {
            _segid1 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew
                                ((ON_SimpleArray<OldCurveJoinSeg> *)Seg_2);
            _segid1->id = pOVar19->id[1];
            _segid1->bRev = (bool)(-(pOVar19->end[1] != 0) & 1);
          }
        }
        else if (*(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                         (long)(1 - pOVar19->end[0]) * 4) ==
                 *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                         (long)(1 - pOVar19->end[1]) * 4)) {
          uVar1 = *(undefined4 *)
                   (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                   (long)(1 - pOVar19->end[0]) * 4);
          *(undefined4 *)
           (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) + (long)pOVar19->end[1] * 4) =
               uVar1;
          *(undefined4 *)
           (*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) + (long)pOVar19->end[0] * 4) =
               uVar1;
        }
        else {
          SArray0._4_4_ =
               *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                       (long)(1 - pOVar19->end[0]) * 4);
          SArray0._0_4_ =
               *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                       (long)(1 - pOVar19->end[1]) * 4);
          SArray1 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::operator[]
                              ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,
                               SArray0._4_4_ + -1);
          _j_2 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::operator[]
                           ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,
                            (int)SArray0 + -1);
          pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,0);
          if (pOVar21->id == pOVar19->id[0]) {
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,0);
            if (pOVar21->id == pOVar19->id[1]) {
              OldReverseSegs(SArray1);
              for (j_3 = 0; iVar12 = j_3, iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_2),
                  uVar6 = SegsArray._16_8_, iVar12 < iVar13; j_3 = j_3 + 1) {
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,j_3);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < **(int **)(uVar6 + (long)pOVar21->id * 8)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,j_3);
                  **(int **)(uVar7 + (long)pOVar21->id * 8) = iVar12;
                }
                uVar6 = SegsArray._16_8_;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,j_3);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < *(int *)(*(long *)(uVar6 + (long)pOVar21->id * 8) + 4)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,j_3);
                  *(int *)(*(long *)(uVar7 + (long)pOVar21->id * 8) + 4) = iVar12;
                }
                pOVar20 = SArray1;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,j_3);
                ON_SimpleArray<OldCurveJoinSeg>::Append(pOVar20,pOVar21);
              }
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                      (long)pOVar19->end[1] * 4) = SArray0._4_4_;
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                      (long)pOVar19->end[0] * 4) = SArray0._4_4_;
              ON_SimpleArray<OldCurveJoinSeg>::SetCount(_j_2,0);
            }
            else {
              for (j_4 = 0; iVar12 = j_4, iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(SArray1),
                  uVar6 = SegsArray._16_8_, iVar12 < iVar13; j_4 = j_4 + 1) {
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,j_4);
                uVar7 = SegsArray._16_8_;
                iVar12 = (int)SArray0;
                if (0 < **(int **)(uVar6 + (long)pOVar21->id * 8)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,j_4);
                  **(int **)(uVar7 + (long)pOVar21->id * 8) = iVar12;
                }
                uVar6 = SegsArray._16_8_;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,j_4);
                uVar7 = SegsArray._16_8_;
                iVar12 = (int)SArray0;
                if (0 < *(int *)(*(long *)(uVar6 + (long)pOVar21->id * 8) + 4)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,j_4);
                  *(int *)(*(long *)(uVar7 + (long)pOVar21->id * 8) + 4) = iVar12;
                }
                pOVar20 = _j_2;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](SArray1,j_4);
                ON_SimpleArray<OldCurveJoinSeg>::Append(pOVar20,pOVar21);
              }
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                      (long)pOVar19->end[1] * 4) = (int)SArray0;
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                      (long)pOVar19->end[0] * 4) = (int)SArray0;
              ON_SimpleArray<OldCurveJoinSeg>::SetCount(SArray1,0);
            }
          }
          else {
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,0);
            if (pOVar21->id == pOVar19->id[1]) {
              for (SArray_3._4_4_ = 0; iVar12 = SArray_3._4_4_,
                  iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_2), uVar6 = SegsArray._16_8_,
                  iVar12 < iVar13; SArray_3._4_4_ = SArray_3._4_4_ + 1) {
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,SArray_3._4_4_);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < **(int **)(uVar6 + (long)pOVar21->id * 8)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,SArray_3._4_4_);
                  **(int **)(uVar7 + (long)pOVar21->id * 8) = iVar12;
                }
                uVar6 = SegsArray._16_8_;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,SArray_3._4_4_);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < *(int *)(*(long *)(uVar6 + (long)pOVar21->id * 8) + 4)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,SArray_3._4_4_);
                  *(int *)(*(long *)(uVar7 + (long)pOVar21->id * 8) + 4) = iVar12;
                }
                pOVar20 = SArray1;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,SArray_3._4_4_);
                ON_SimpleArray<OldCurveJoinSeg>::Append(pOVar20,pOVar21);
              }
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                      (long)pOVar19->end[1] * 4) = SArray0._4_4_;
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                      (long)pOVar19->end[0] * 4) = SArray0._4_4_;
              ON_SimpleArray<OldCurveJoinSeg>::SetCount(_j_2,0);
            }
            else {
              OldReverseSegs(_j_2);
              for (SArray_3._0_4_ = 0; iVar12 = (int)SArray_3,
                  iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_2), uVar6 = SegsArray._16_8_,
                  iVar12 < iVar13; SArray_3._0_4_ = (int)SArray_3 + 1) {
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,(int)SArray_3);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < **(int **)(uVar6 + (long)pOVar21->id * 8)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,(int)SArray_3);
                  **(int **)(uVar7 + (long)pOVar21->id * 8) = iVar12;
                }
                uVar6 = SegsArray._16_8_;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,(int)SArray_3);
                uVar7 = SegsArray._16_8_;
                iVar12 = SArray0._4_4_;
                if (0 < *(int *)(*(long *)(uVar6 + (long)pOVar21->id * 8) + 4)) {
                  pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,(int)SArray_3);
                  *(int *)(*(long *)(uVar7 + (long)pOVar21->id * 8) + 4) = iVar12;
                }
                pOVar20 = SArray1;
                pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_2,(int)SArray_3);
                ON_SimpleArray<OldCurveJoinSeg>::Append(pOVar20,pOVar21);
              }
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[1] * 8) +
                      (long)pOVar19->end[1] * 4) = SArray0._4_4_;
              *(int *)(*(long *)(SegsArray._16_8_ + (long)pOVar19->id[0] * 8) +
                      (long)pOVar19->end[0] * 4) = SArray0._4_4_;
              ON_SimpleArray<OldCurveJoinSeg>::SetCount(_j_2,0);
            }
          }
        }
      }
    }
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::Count
                           ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3),
        iVar12 < iVar13; dim = dim + 1) {
      _j_6 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::operator[]
                       ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3,dim);
      iVar12 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6);
      if (1 < iVar12) {
        if ((key_local._7_1_ & 1) == 0) {
          PC._4_4_ = 0;
          for (PC._0_4_ = 0; iVar12 = (int)PC, iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6)
              , iVar12 < iVar13; PC._0_4_ = (int)PC + 1) {
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,(int)PC);
            if ((pOVar21->bRev & 1U) != 0) {
              PC._4_4_ = PC._4_4_ + 1;
            }
          }
          iVar12 = PC._4_4_ * 2;
          iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6);
          if (iVar13 < iVar12) {
            OldReverseSegs(_j_6);
          }
        }
        pOVar23 = (ON_PolyCurve *)operator_new(0x40);
        iVar12 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6);
        ON_PolyCurve::ON_PolyCurve(pOVar23,iVar12);
        min_seg._3_1_ = 0;
        C_1._4_4_ = 0;
        C_1._0_4_ = -1;
        min_id = 0;
        _j_5 = pOVar23;
LAB_005972a5:
        iVar12 = min_id;
        iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6);
        if (iVar12 < iVar13) {
          if (_count != (ON_SimpleArray<int> *)0x0) {
            iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)join_tol_local)
            ;
            pOVar8 = _count;
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id);
            piVar16 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_78,pOVar21->id);
            piVar16 = ON_SimpleArray<int>::operator[](pOVar8,*piVar16);
            *piVar16 = iVar12;
          }
          pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id);
          ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                               ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,pOVar21->id);
          pOStack_200 = (ON_NurbsCurve *)*ppOVar15;
          if (((int)C_1 < 0) ||
             (pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id),
             pOVar21->id < (int)C_1)) {
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id);
            C_1._0_4_ = pOVar21->id;
            C_1._4_4_ = min_id;
          }
          pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id);
          if ((pOVar21->bRev & 1U) != 0) {
            (*(pOStack_200->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      ();
          }
          iVar12 = ON_PolyCurve::Count(_j_5);
          if ((iVar12 == 0) ||
             (bVar10 = ON_ForceMatchCurveEnds
                                 (&_j_5->super_ON_Curve,1,&pOStack_200->super_ON_Curve,0), bVar10))
          goto LAB_0059790d;
          ON_Curve::PointAtEnd((ON_3dPoint *)&Q.z,&_j_5->super_ON_Curve);
          ON_Curve::PointAtStart((ON_3dPoint *)local_240,&pOStack_200->super_ON_Curve);
          ON_3dPoint::operator+(&local_270,(ON_3dPoint *)&Q.z,(ON_3dPoint *)local_240);
          operator*(&local_258,0.5,&local_270);
          dVar5 = local_258.z;
          dVar3 = local_258.y;
          Q.z = local_258.x;
          local_278 = local_258.z;
          local_288 = local_258.x;
          dStack_280 = local_258.y;
          uVar14 = (*(_j_5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])
                             ();
          if ((uVar14 & 1) != 0) {
            local_298 = dVar5;
            NC = (ON_NurbsCurve *)Q.z;
            dStack_2a0 = dVar3;
            uVar14 = (*(pOStack_200->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                       _vptr_ON_Object[0x39])();
            if ((uVar14 & 1) != 0) goto LAB_0059790d;
          }
          local_2b0 = ON_Curve::NurbsCurve
                                (&pOStack_200->super_ON_Curve,(ON_NurbsCurve *)0x0,0.0,
                                 (ON_Interval *)0x0);
          if (local_2b0 != (ON_NurbsCurve *)0x0) {
            local_2b8 = dVar5;
            local_2c8 = Q.z;
            dStack_2c0 = dVar3;
            uVar14 = (*(local_2b0->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                       [0x39])();
            if ((uVar14 & 1) != 0) {
              if (pOStack_200 != (ON_NurbsCurve *)0x0) {
                (*(pOStack_200->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4]
                )();
              }
              pOStack_200 = local_2b0;
              goto LAB_0059790d;
            }
          }
          if (local_2b0 != (ON_NurbsCurve *)0x0) {
            (*(local_2b0->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
          iVar12 = ON_PolyCurve::Count(_j_5);
          if (iVar12 != 0) {
            min_seg._3_1_ = 1;
            pOStack_2d0 = _j_5;
            ON_SimpleArray<ON_Curve_*>::Append
                      ((ON_SimpleArray<ON_Curve_*> *)join_tol_local,
                       (ON_Curve **)&stack0xfffffffffffffd30);
          }
          pOVar8 = _count;
          if (_count != (ON_SimpleArray<int> *)0x0) {
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,min_id);
            piVar16 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_78,pOVar21->id);
            piVar16 = ON_SimpleArray<int>::operator[](pOVar8,*piVar16);
            *piVar16 = *piVar16 + 1;
          }
          ON_SimpleArray<ON_Curve_*>::Append
                    ((ON_SimpleArray<ON_Curve_*> *)join_tol_local,
                     (ON_Curve **)&stack0xfffffffffffffe00);
          pPoly._4_4_ = min_id;
          while( true ) {
            pPoly._4_4_ = pPoly._4_4_ + 1;
            iVar12 = pPoly._4_4_;
            iVar13 = ON_SimpleArray<OldCurveJoinSeg>::Count(_j_6);
            if (iVar13 <= iVar12) break;
            if (_count != (ON_SimpleArray<int> *)0x0) {
              iVar12 = ON_SimpleArray<ON_Curve_*>::Count
                                 ((ON_SimpleArray<ON_Curve_*> *)join_tol_local);
              pOVar8 = _count;
              pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,pPoly._4_4_);
              piVar16 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_78,pOVar21->id)
              ;
              piVar16 = ON_SimpleArray<int>::operator[](pOVar8,*piVar16);
              *piVar16 = iVar12;
            }
            dVar3 = join_tol_local;
            pOVar21 = ON_SimpleArray<OldCurveJoinSeg>::operator[](_j_6,pPoly._4_4_);
            ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                                 ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,pOVar21->id);
            ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)dVar3,ppOVar15);
          }
        }
        iVar12 = ON_PolyCurve::Count(_j_5);
        if (iVar12 == 0) {
          if (_j_5 != (ON_PolyCurve *)0x0) {
            (*(_j_5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
        }
        else if ((min_seg._3_1_ & 1) == 0) {
          uVar14 = (*(_j_5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])
                             ();
          if ((((uVar14 & 1) == 0) &&
              (bVar10 = ON_Curve::IsClosable(&_j_5->super_ON_Curve,dStack_28,0.0,10.0), bVar10)) &&
             (bVar10 = ON_ForceMatchCurveEnds(&_j_5->super_ON_Curve,0,&_j_5->super_ON_Curve,1),
             pOVar23 = _j_5, !bVar10)) {
            ON_Curve::PointAtStart((ON_3dPoint *)&t,&_j_5->super_ON_Curve);
            (*(pOVar23->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
          }
          uVar14 = (*(_j_5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])
                             ();
          if (((uVar14 & 1) != 0) && (-1 < (int)C_1)) {
            OVar25 = ON_PolyCurve::SegmentDomain(_j_5,C_1._4_4_);
            local_328.m_t[1] = OVar25.m_t[1];
            local_328.m_t[0] = OVar25.m_t[0];
            pdVar24 = ON_Interval::operator[](&local_328,0);
            local_318 = *pdVar24;
            (*(_j_5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x27])
                      (SUB84(local_318,0));
          }
          ON_PolyCurve::RemoveNesting(_j_5);
          ON_PolyCurve::SynchronizeSegmentDomains(_j_5);
          C_2 = &_j_5->super_ON_Curve;
          ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)join_tol_local,&C_2);
        }
      }
    }
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count),
        iVar12 < iVar13; dim = dim + 1) {
      if ((**(int **)(SegsArray._16_8_ + (long)dim * 8) == 0) &&
         (*(int *)(*(long *)(SegsArray._16_8_ + (long)dim * 8) + 4) == 0)) {
        if (_count != (ON_SimpleArray<int> *)0x0) {
          iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)join_tol_local);
          pOVar8 = _count;
          piVar16 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_78,dim);
          piVar16 = ON_SimpleArray<int>::operator[](pOVar8,*piVar16);
          *piVar16 = iVar12;
        }
        dVar3 = join_tol_local;
        ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                             ((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count,dim);
        ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)dVar3,ppOVar15);
      }
    }
    for (dim = 0; iVar12 = dim,
        iVar13 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)join_tol_local),
        iVar12 < iVar13; dim = dim + 1) {
      ppOVar15 = ON_SimpleArray<ON_Curve_*>::operator[]
                           ((ON_SimpleArray<ON_Curve_*> *)join_tol_local,dim);
      local_338 = *ppOVar15;
      if (((local_338 != (ON_Curve *)0x0) &&
          (uVar14 = (*(local_338->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(),
          (uVar14 & 1) == 0)) &&
         (bVar10 = ON_Curve::IsClosable(local_338,dStack_28,0.0,10.0), pOVar4 = local_338, bVar10))
      {
        ON_Curve::PointAtStart(&local_350,local_338);
        (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
      }
    }
    onfree((void *)SegsArray._16_8_);
    onfree(__s);
    iVar12 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)join_tol_local);
    InCurves_local._4_4_ = iVar12 - iVar11;
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::~ON_ClassArray
              ((ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> *)&ED_3);
    ON_SimpleArray<OldCurveJoinEndData>::~ON_SimpleArray
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_108);
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_c0);
    ON_3dPointArray::~ON_3dPointArray
              ((ON_3dPointArray *)&End.super_ON_SimpleArray<ON_3dPoint>.m_count);
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_78);
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&cmap.m_count);
  }
  return InCurves_local._4_4_;
LAB_0059790d:
  pOStack_2e0 = ON_PolyCurve::Cast((ON_Object *)pOStack_200);
  if (pOStack_2e0 == (ON_PolyCurve *)0x0) {
    ON_PolyCurve::Append(_j_5,&pOStack_200->super_ON_Curve);
  }
  else {
    for (SC._4_4_ = 0; iVar12 = SC._4_4_, iVar13 = ON_PolyCurve::Count(pOStack_2e0), iVar12 < iVar13
        ; SC._4_4_ = SC._4_4_ + 1) {
      SCCopy = ON_PolyCurve::SegmentCurve(pOStack_2e0,SC._4_4_);
      iVar12 = (*(SCCopy->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      local_2f8 = (ON_Curve *)CONCAT44(extraout_var_00,iVar12);
      if (local_2f8 != (ON_Curve *)0x0) {
        ON_PolyCurve::Append(_j_5,local_2f8);
      }
    }
    if (pOStack_2e0 != (ON_PolyCurve *)0x0) {
      (*(pOStack_2e0->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
  }
  min_id = min_id + 1;
  goto LAB_005972a5;
}

Assistant:

int 
ON_JoinCurvesOld(const ON_SimpleArray<const ON_Curve*>& InCurves,
  ON_SimpleArray<ON_Curve*>& OutCurves,
  double join_tol,
  bool bPreserveDirection, // = false
  ON_SimpleArray<int>* key //=0
)

{

  int i, count = OutCurves.Count();
  if (InCurves.Count() < 1)
    return 0;

  int dim = InCurves[0]->Dimension();
  for (i=1; i<InCurves.Count(); i++){
    if (InCurves[i]->Dimension() != dim) return 0;
  }

  if (key) {
    key->Reserve(InCurves.Count());
    for (i=0; i<InCurves.Count(); i++) key->Append(-1);
  }

  //Copy curves, take out closed curves. 
  OutCurves.Reserve(InCurves.Count());
  ON_SimpleArray<ON_Curve*> IC(InCurves.Count());
  ON_SimpleArray<int> cmap(InCurves.Count());
  for (i=0; i<InCurves.Count(); i++){
    ON_Curve* C = InCurves[i]->DuplicateCurve();
    if (!C) continue;
    if (C->IsClosed()) {
      if (key) (*key)[i] = OutCurves.Count();
      OutCurves.Append(C);
    }
    else {
      cmap.Append(i);
      IC.Append(C);
    }
  }

  //IC is a list of copies of all open curves.  match endpoints and join into polycurves.
  //copy curves that are not joined.
  ON_3dPointArray Start(IC.Count());
  Start.SetCount(IC.Count());
  ON_3dPointArray End(IC.Count());
  End.SetCount(IC.Count());
  for (i=0; i<IC.Count(); i++){
    Start[i] = IC[i]->PointAtStart();
    End[i] = IC[i]->PointAtEnd();
  }

  //get a list of all possible joins
  ON_SimpleArray<OldCurveJoinEndData> EData(IC.Count());
  for (i=0; i<IC.Count(); i++){
    int j;
    for (j=0; j<IC.Count(); j++){
      if (i==j) continue;
      double dist = Start[i].DistanceTo(End[j]);
      if (dist <= join_tol){
        OldCurveJoinEndData& ED = EData.AppendNew();
        ED.id[0] = i;
        ED.end[0] = 0;
        ED.id[1] = j;
        ED.end[1] = 1;
        ED.dist = dist;
      }
      if (!bPreserveDirection && i<j){
        dist = Start[i].DistanceTo(Start[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 0;
          ED.id[1] = j;
          ED.end[1] = 0;
          ED.dist = dist;
        }
        dist = End[i].DistanceTo(End[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 1;
          ED.id[1] = j;
          ED.end[1] = 1;
          ED.dist = dist;
        }
      }
    }
  }

  //sort possibilities by distance
  EData.QuickSort(OldCompareEndData);

  int* endspace = (int*)onmalloc(2*sizeof(int)*IC.Count());
  memset(endspace, 0, 2*sizeof(int)*IC.Count());
  int** endarray = (int**)onmalloc(sizeof(int*)*IC.Count());

  //endarray[i] is an int[2].  if endarray[i][0] > 0, then IC[i] is part of
  //polycurve endarray[i][0] - 1, and the start of IC[i] is interior to the polycurve.
  //if endarray[i][1] > 0, then the end of IC[i] is interior.  if both endarray[i][0] > 0
  //and endarray[i][1] > 0, then they are equal.

  for (i=0; i<IC.Count(); i++)
    endarray[i] = &endspace[2*i];

  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg> > SegsArray(IC.Count());

  for (i=0; i<EData.Count(); i++){
    const OldCurveJoinEndData& ED = EData[i];
    if (endarray[ED.id[0]][ED.end[0]] > 0 || endarray[ED.id[1]][ED.end[1]] > 0)
      continue; //one of these endpoints has already been join to a closer end
    if (endarray[ED.id[0]][1 - ED.end[0]] == 0){
      if (endarray[ED.id[1]][1 - ED.end[1]] == 0){//new curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = SegsArray.Count()+1;
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray.AppendNew();
        SArray.Reserve(4);
        OldCurveJoinSeg& Seg0 = SArray.AppendNew();
        OldCurveJoinSeg& Seg1 = SArray.AppendNew();
        if (ED.end[0]) {
          Seg0.id = ED.id[0];
          Seg0.bRev = false;
          Seg1.id = ED.id[1];
          Seg1.bRev = (ED.end[1]) ? true : false;
        }
        else {
          Seg1.id = ED.id[0];
          Seg1.bRev = false;
          Seg0.id = ED.id[1];
          Seg0.bRev = (ED.end[1]) ? false : true;
        }
      }

      else {

        //second curve is part of an existing sequence. Insert or append first curve.
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[1]][1 - ED.end[1]] - 1];
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
          endarray[ED.id[1]][1 - ED.end[1]];

        if (SArray[0].id == ED.id[1]){
          OldCurveJoinSeg Seg;
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? false : true;
          SArray.Insert(0, Seg);
        }
        else {
          OldCurveJoinSeg& Seg = SArray.AppendNew();
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? true : false;
        }
      }
    }
    else if (endarray[ED.id[1]][1 - ED.end[1]] == 0){
      //first curve is part of an existing sequence. Insert or append second curve.
      ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[0]][1 - ED.end[0]] - 1];
      endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];

      if (SArray[0].id == ED.id[0]){
        OldCurveJoinSeg Seg;
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? false : true;
        SArray.Insert(0, Seg);
      }
      else {
        OldCurveJoinSeg& Seg = SArray.AppendNew();
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? true : false;
      }
    }
    else {
      //both are in existing sequences.  join the sequences.
      if (endarray[ED.id[0]][1 - ED.end[0]] == endarray[ED.id[1]][1 - ED.end[1]])
        //closes off this curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];
      else {
        int segid0 = endarray[ED.id[0]][1 - ED.end[0]];
        int segid1 = endarray[ED.id[1]][1 - ED.end[1]];
        ON_SimpleArray<OldCurveJoinSeg>& SArray0 = SegsArray[segid0 - 1];
        ON_SimpleArray<OldCurveJoinSeg>& SArray1 = SegsArray[segid1 - 1];
        if (SArray0[0].id == ED.id[0]){
          if (SArray1[0].id == ED.id[1]){
            OldReverseSegs(SArray0);
            int j;
            for (j=0; j<SArray1.Count(); j++){
              if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
              if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
              SArray0.Append(SArray1[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
            SArray1.SetCount(0);
          }
          else {
            int j;
            for (j=0; j<SArray0.Count(); j++){
              if (endarray[SArray0[j].id][0] > 0) endarray[SArray0[j].id][0] = segid1;
              if (endarray[SArray0[j].id][1] > 0) endarray[SArray0[j].id][1] = segid1;
              SArray1.Append(SArray0[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid1;
            SArray0.SetCount(0);
          }
        }
        else if (SArray1[0].id == ED.id[1]){
          int j;
          for (j=0; j<SArray1.Count(); j++){
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
        else {
          OldReverseSegs(SArray1);
          int j;
          for (j=0; j<SArray1.Count(); j++) {
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
      }
    }
  }

  //make polycurves out of sequences

  for (i=0; i<SegsArray.Count(); i++){
    ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[i];
    if (SArray.Count() < 2) continue;
    if (!bPreserveDirection){//if number of reversed segs is more than half, reverse.
      int scount= 0;
      int j;
      for (j=0; j<SArray.Count(); j++) {
        if (SArray[j].bRev)
          scount++;
      }
      if (2*scount > SArray.Count())
        OldReverseSegs(SArray);
    }
    ON_PolyCurve* PC = new ON_PolyCurve(SArray.Count());
    bool pc_added = false;
    int j;
    int min_seg = 0;
    int min_id = -1;
    for (j=0; j<SArray.Count(); j++){
      if (key) 
        (*key)[cmap[SArray[j].id]] = OutCurves.Count();
      ON_Curve* C = IC[SArray[j].id];
      if (min_id < 0 || SArray[j].id < min_id){
        min_id = SArray[j].id;
        min_seg = j;
      }
      if (SArray[j].bRev) C->Reverse();
      if (PC->Count()){
        bool bSet = true;
        if (!ON_ForceMatchCurveEnds(*PC, 1, *C, 0)) {
          ON_3dPoint P = PC->PointAtEnd();
          ON_3dPoint Q = C->PointAtStart();
          P = 0.5*(P+Q);
          if (!PC->SetEndPoint(P) || !C->SetStartPoint(P)) {
            ON_NurbsCurve* NC = C->NurbsCurve();
            if (NC && NC->SetStartPoint(P)){
              delete C;
              C = NC;
            }
            else {
              bSet = false;
              delete NC;
              if (PC->Count()) {
                pc_added = true;
                OutCurves.Append(PC);
              }
              if (key)
                (*key)[cmap[SArray[j].id]]++;
              OutCurves.Append(C);
              int k;
              for (k=j+1; k<SArray.Count(); k++){
                if (key)
                  (*key)[cmap[SArray[k].id]] = OutCurves.Count();
                OutCurves.Append(IC[SArray[k].id]);
              }
              break;
            }
          }
        }
      }
      ON_PolyCurve* pPoly = ON_PolyCurve::Cast(C);
      if( pPoly){
        int si;
        for (si=0; si<pPoly->Count(); si++){
          const ON_Curve* SC = pPoly->SegmentCurve(si);
          ON_Curve* SCCopy = SC->DuplicateCurve();
          if (SCCopy) PC->Append(SCCopy);
        }
        delete pPoly;
      }
      else PC->Append(C);
    }
    if (!PC->Count()) delete PC;
    else if (!pc_added) {
      if (!PC->IsClosed() && PC->IsClosable(join_tol)){
        if (!ON_ForceMatchCurveEnds(*PC, 0, *PC, 1))
          PC->SetEndPoint(PC->PointAtStart());
      }
      if (PC->IsClosed() && min_id >= 0){
        //int sc = PC->SpanCount();
        double t = PC->SegmentDomain(min_seg)[0];
        PC->ChangeClosedCurveSeam(t);
      }

      // 28 October 2010 Dale Lear
      //    I added the RemoveNesting() and SynchronizeSegmentDomains()
      //    lines so Rhino will create higher quality geometry.
      PC->RemoveNesting();
      PC->SynchronizeSegmentDomains();

      OutCurves.Append(PC);
    }
  }

  //add in singletons
  for (i=0; i<IC.Count(); i++){
    if (endarray[i][0] == 0 && endarray[i][1] == 0){
      if (key) (*key)[cmap[i]] = OutCurves.Count();
      OutCurves.Append(IC[i]);
    }
  }

  /* This was added by greg to fix big curves that are nearly, but not quite, closed.
  It causes problems when the curve is tiny.
  for(i=0; i<OutCurves.Count(); i++){
  if(!OutCurves[i]->IsClosed()){
  ON_3dPoint s= OutCurves[i]->PointAtStart();
  ON_3dPoint e = OutCurves[i]->PointAtEnd();
  if(s.DistanceTo(e)<join_tol)
  OutCurves[i]->SetEndPoint( s );			
  }
  }
  */

  //Chuck added this, 1/16/03.
  for(i=0; i<OutCurves.Count(); i++){
    ON_Curve* C = OutCurves[i];
    if (!C || C->IsClosed()) continue;
    if (C->IsClosable(join_tol))
      C->SetEndPoint(C->PointAtStart());
  }

  onfree((void*)endarray);
  onfree((void*)endspace);

  return OutCurves.Count() - count;
}